

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O1

char * uv_err_name(int err)

{
  char *pcVar1;
  
  if (err < -0x7d) {
    if (err < -0xfbc) {
      if (err == -0xfff) {
        return "EOF";
      }
      if (err == -0xffe) {
        return "UNKNOWN";
      }
      if (err == -0xff0) {
        return "ECHARSET";
      }
    }
    else {
      switch(err) {
      case -0xbc6:
        return "EAI_PROTOCOL";
      case -0xbc5:
        return "EAI_BADHINTS";
      case -0xbc4:
        break;
      case -0xbc3:
        return "EAI_SOCKTYPE";
      case -0xbc2:
        return "EAI_SERVICE";
      case -0xbc1:
        return "EAI_OVERFLOW";
      case -0xbc0:
        return "EAI_NONAME";
      case -0xbbf:
        return "EAI_NODATA";
      case -0xbbe:
        return "EAI_MEMORY";
      case -0xbbd:
        return "EAI_FAMILY";
      case -0xbbc:
        return "EAI_FAIL";
      case -0xbbb:
        return "EAI_CANCELED";
      case -0xbba:
        return "EAI_BADFLAGS";
      case -0xbb9:
        return "EAI_AGAIN";
      case -3000:
        return "EAI_ADDRFAMILY";
      default:
        if (err == -0xfbc) {
          return "EFTYPE";
        }
      }
    }
  }
  else {
    switch(err) {
    case -0x7d:
      return "ECANCELED";
    case -0x79:
      return "EREMOTEIO";
    case -0x72:
      return "EALREADY";
    case -0x71:
      return "EHOSTUNREACH";
    case -0x70:
      return "EHOSTDOWN";
    case -0x6f:
      return "ECONNREFUSED";
    case -0x6e:
      return "ETIMEDOUT";
    case -0x6c:
      return "ESHUTDOWN";
    case -0x6b:
      return "ENOTCONN";
    case -0x6a:
      return "EISCONN";
    case -0x69:
      return "ENOBUFS";
    case -0x68:
      return "ECONNRESET";
    case -0x67:
      return "ECONNABORTED";
    case -0x65:
      return "ENETUNREACH";
    case -100:
      return "ENETDOWN";
    case -99:
      return "EADDRNOTAVAIL";
    case -0x62:
      return "EADDRINUSE";
    case -0x61:
      return "EAFNOSUPPORT";
    case -0x5f:
      return "ENOTSUP";
    case -0x5d:
      return "EPROTONOSUPPORT";
    case -0x5c:
      return "ENOPROTOOPT";
    case -0x5b:
      return "EPROTOTYPE";
    case -0x5a:
      return "EMSGSIZE";
    case -0x59:
      return "EDESTADDRREQ";
    case -0x58:
      return "ENOTSOCK";
    case -0x47:
      return "EPROTO";
    case -0x40:
      return "ENONET";
    case -0x28:
      return "ELOOP";
    case -0x27:
      return "ENOTEMPTY";
    case -0x26:
      return "ENOSYS";
    case -0x24:
      return "ENAMETOOLONG";
    case -0x22:
      return "ERANGE";
    case -0x20:
      return "EPIPE";
    case -0x1f:
      return "EMLINK";
    case -0x1e:
      return "EROFS";
    case -0x1d:
      return "ESPIPE";
    case -0x1c:
      return "ENOSPC";
    case -0x1b:
      return "EFBIG";
    case -0x1a:
      return "ETXTBSY";
    case -0x19:
      return "ENOTTY";
    case -0x18:
      return "EMFILE";
    case -0x17:
      return "ENFILE";
    case -0x16:
      return "EINVAL";
    case -0x15:
      return "EISDIR";
    case -0x14:
      return "ENOTDIR";
    case -0x13:
      return "ENODEV";
    case -0x12:
      return "EXDEV";
    case -0x11:
      return "EEXIST";
    case -0x10:
      return "EBUSY";
    case -0xe:
      return "EFAULT";
    case -0xd:
      return "EACCES";
    case -0xc:
      return "ENOMEM";
    case -0xb:
      return "EAGAIN";
    case -9:
      return "EBADF";
    case -7:
      return "E2BIG";
    case -6:
      return "ENXIO";
    case -5:
      return "EIO";
    case -4:
      return "EINTR";
    case -3:
      return "ESRCH";
    case -2:
      return "ENOENT";
    case -1:
      return "EPERM";
    }
  }
  pcVar1 = uv__unknown_err_code(err);
  return pcVar1;
}

Assistant:

const char* uv_err_name(int err) {
  switch (err) {
    UV_ERRNO_MAP(UV_ERR_NAME_GEN)
  }
  return uv__unknown_err_code(err);
}